

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopicTree.h
# Opt level: O0

void __thiscall uWS::TopicTree::unsubscribeAll(TopicTree *this,Subscriber *subscriber)

{
  bool bVar1;
  reference ppTVar2;
  long in_RSI;
  list<uWS::Topic_*,_std::allocator<uWS::Topic_*>_> *in_RDI;
  Topic *topic;
  iterator __end3;
  iterator __begin3;
  list<uWS::Topic_*,_std::allocator<uWS::Topic_*>_> *__range3;
  Topic *in_stack_00000208;
  TopicTree *in_stack_00000210;
  Topic *in_stack_ffffffffffffffd0;
  _Self local_28;
  _Self local_20 [4];
  
  if (in_RSI != 0) {
    local_20[0]._M_node =
         (_List_node_base *)
         std::__cxx11::list<uWS::Topic_*,_std::allocator<uWS::Topic_*>_>::begin(in_RDI);
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<uWS::Topic_*,_std::allocator<uWS::Topic_*>_>::end(in_RDI);
    while( true ) {
      bVar1 = std::operator!=(local_20,&local_28);
      if (!bVar1) break;
      ppTVar2 = std::_List_iterator<uWS::Topic_*>::operator*
                          ((_List_iterator<uWS::Topic_*> *)in_stack_ffffffffffffffd0);
      in_stack_ffffffffffffffd0 = *ppTVar2;
      std::set<uWS::Subscriber_*,_std::less<uWS::Subscriber_*>,_std::allocator<uWS::Subscriber_*>_>
      ::erase((set<uWS::Subscriber_*,_std::less<uWS::Subscriber_*>,_std::allocator<uWS::Subscriber_*>_>
               *)in_stack_ffffffffffffffd0,(key_type *)in_RDI);
      trimTree(in_stack_00000210,in_stack_00000208);
      std::_List_iterator<uWS::Topic_*>::operator++(local_20);
    }
    std::__cxx11::list<uWS::Topic_*,_std::allocator<uWS::Topic_*>_>::clear
              ((list<uWS::Topic_*,_std::allocator<uWS::Topic_*>_> *)in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

void unsubscribeAll(Subscriber *subscriber) {
        if (subscriber) {
            for (Topic *topic : subscriber->subscriptions) {
                topic->subs.erase(subscriber);
                trimTree(topic);
            }
            subscriber->subscriptions.clear();
        }
    }